

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_llvm_builtins.cpp
# Opt level: O0

bool dxil_spv::analyze_load_instruction(Impl *impl,LoadInst *inst)

{
  undefined3 uVar1;
  undefined7 uVar2;
  bool bVar3;
  uint uVar4;
  Value *pVVar5;
  pointer ppVar6;
  Type *this;
  ConstantExpr *this_00;
  pointer ppVar7;
  mapped_type *pmVar8;
  byte local_a1;
  Value *local_90;
  _Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false>
  local_88;
  Value *local_80;
  _Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false>
  local_78;
  iterator itr;
  Constant *local_68;
  _Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false>
  local_60;
  iterator itr_1;
  Constant *ptr;
  ConstantExpr *const_expr;
  undefined1 local_40 [8];
  AllocaTrackedIndex tracked;
  LoadInst *inst_local;
  Impl *impl_local;
  
  tracked.cbv_handle = (Value *)inst;
  pVVar5 = LLVMBC::LoadInst::getPointerOperand(inst);
  gep_pointer_to_alloca_tracked_inst((AllocaTrackedIndex *)local_40,impl,pVVar5);
  if (tracked.itr.
      super__Node_iterator_base<std::pair<const_LLVMBC::AllocaInst_*const,_dxil_spv::AllocaCBVForwardingTracking>,_false>
      ._M_cur != (__node_type *)0x0) {
    ppVar6 = std::__detail::
             _Node_iterator<std::pair<const_LLVMBC::AllocaInst_*const,_dxil_spv::AllocaCBVForwardingTracking>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_LLVMBC::AllocaInst_*const,_dxil_spv::AllocaCBVForwardingTracking>,_false,_false>
                           *)&tracked.index);
    (ppVar6->second).has_load = true;
    pVVar5 = LLVMBC::LoadInst::getPointerOperand((LoadInst *)tracked.cbv_handle);
    const_expr = (ConstantExpr *)LLVMBC::cast<LLVMBC::GetElementPtrInst>(pVVar5);
    std::
    unordered_set<const_LLVMBC::GetElementPtrInst_*,_std::hash<const_LLVMBC::GetElementPtrInst_*>,_std::equal_to<const_LLVMBC::GetElementPtrInst_*>,_dxil_spv::ThreadLocalAllocator<const_LLVMBC::GetElementPtrInst_*>_>
    ::erase(&impl->masked_alloca_forward_gep,(key_type *)&const_expr);
  }
  pVVar5 = LLVMBC::LoadInst::getPointerOperand((LoadInst *)tracked.cbv_handle);
  this = LLVMBC::Value::getType(pVVar5);
  uVar4 = LLVMBC::Type::getPointerAddressSpace(this);
  if ((char)uVar4 == '\x03') {
    (impl->shader_analysis).has_group_shared_access = true;
  }
  pVVar5 = LLVMBC::LoadInst::getPointerOperand((LoadInst *)tracked.cbv_handle);
  this_00 = LLVMBC::dyn_cast<LLVMBC::ConstantExpr>(pVVar5);
  if ((this_00 != (ConstantExpr *)0x0) &&
     (uVar4 = LLVMBC::ConstantExpr::getOpcode(this_00), uVar4 == 200)) {
    local_68 = LLVMBC::ConstantExpr::getOperand(this_00,0);
    itr_1.
    super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false>
    ._M_cur = (_Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false>
               )(_Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false>
                 )local_68;
    local_60._M_cur =
         (__node_type *)
         std::
         unordered_map<const_LLVMBC::Value_*,_dxil_spv::Converter::Impl::ResourceMetaReference,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>_>_>
         ::find(&impl->llvm_global_variable_to_resource_mapping,(key_type *)&local_68);
    itr = std::
          unordered_map<const_LLVMBC::Value_*,_dxil_spv::Converter::Impl::ResourceMetaReference,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>_>_>
          ::end(&impl->llvm_global_variable_to_resource_mapping);
    bVar3 = std::__detail::operator!=
                      (&local_60,
                       &itr.
                        super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false>
                      );
    local_a1 = 0;
    if (bVar3) {
      ppVar7 = std::__detail::
               _Node_iterator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false,_false>
                             *)&local_60);
      bVar3 = emit_getelementptr_resource<LLVMBC::ConstantExpr>(impl,this_00,&ppVar7->second);
      local_a1 = bVar3 ^ 0xff;
    }
    if ((local_a1 & 1) != 0) {
      return false;
    }
  }
  local_80 = LLVMBC::LoadInst::getPointerOperand((LoadInst *)tracked.cbv_handle);
  local_78._M_cur =
       (__node_type *)
       std::
       unordered_map<const_LLVMBC::Value_*,_dxil_spv::Converter::Impl::ResourceMetaReference,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>_>_>
       ::find(&impl->llvm_global_variable_to_resource_mapping,&local_80);
  local_88._M_cur =
       (__node_type *)
       std::
       unordered_map<const_LLVMBC::Value_*,_dxil_spv::Converter::Impl::ResourceMetaReference,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>_>_>
       ::end(&impl->llvm_global_variable_to_resource_mapping);
  bVar3 = std::__detail::operator!=(&local_78,&local_88);
  if (bVar3) {
    ppVar7 = std::__detail::
             _Node_iterator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false,_false>
                           *)&local_78);
    local_90 = tracked.cbv_handle;
    pmVar8 = std::
             unordered_map<const_LLVMBC::Value_*,_dxil_spv::Converter::Impl::ResourceMetaReference,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>_>_>
             ::operator[](&impl->llvm_global_variable_to_resource_mapping,&local_90);
    uVar1 = *(undefined3 *)&(ppVar7->second).field_0x1;
    uVar4 = (ppVar7->second).meta_index;
    pmVar8->type = (ppVar7->second).type;
    *(undefined3 *)&pmVar8->field_0x1 = uVar1;
    pmVar8->meta_index = uVar4;
    pmVar8->offset = (ppVar7->second).offset;
    pmVar8->variable = (ppVar7->second).variable;
    uVar2 = *(undefined7 *)&(ppVar7->second).field_0x19;
    pmVar8->non_uniform = (ppVar7->second).non_uniform;
    *(undefined7 *)&pmVar8->field_0x19 = uVar2;
  }
  return true;
}

Assistant:

bool analyze_load_instruction(Converter::Impl &impl, const llvm::LoadInst *inst)
{
	auto tracked = gep_pointer_to_alloca_tracked_inst(impl, inst->getPointerOperand());
	if (tracked.cbv_handle)
	{
		tracked.itr->second.has_load = true;
		// We'll need this GEP after all.
		impl.masked_alloca_forward_gep.erase(llvm::cast<llvm::GetElementPtrInst>(inst->getPointerOperand()));
	}

	if (DXIL::AddressSpace(inst->getPointerOperand()->getType()->getPointerAddressSpace()) == DXIL::AddressSpace::GroupShared)
		impl.shader_analysis.has_group_shared_access = true;

	if (auto *const_expr = llvm::dyn_cast<llvm::ConstantExpr>(inst->getPointerOperand()))
	{
		if (const_expr->getOpcode() == llvm::Instruction::GetElementPtr)
		{
			auto *ptr = const_expr->getOperand(0);
			auto itr = impl.llvm_global_variable_to_resource_mapping.find(ptr);
			if (itr != impl.llvm_global_variable_to_resource_mapping.end() &&
			    !emit_getelementptr_resource(impl, const_expr, itr->second))
			{
				return false;
			}
		}
	}

	auto itr = impl.llvm_global_variable_to_resource_mapping.find(inst->getPointerOperand());
	if (itr != impl.llvm_global_variable_to_resource_mapping.end())
		impl.llvm_global_variable_to_resource_mapping[inst] = itr->second;

	return true;
}